

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImU32 ImHashData(void *data_p,size_t data_size,ImU32 seed)

{
  byte *pbVar1;
  uint uVar2;
  size_t sVar3;
  uchar *data;
  
  if (data_size != 0) {
    uVar2 = ~seed;
    sVar3 = 0;
    do {
      pbVar1 = (byte *)((long)data_p + sVar3);
      sVar3 = sVar3 + 1;
      uVar2 = uVar2 >> 8 ^ GCrc32LookupTable[(uint)*pbVar1 ^ uVar2 & 0xff];
    } while (data_size != sVar3);
    seed = ~uVar2;
  }
  return seed;
}

Assistant:

ImU32 ImHashData(const void* data_p, size_t data_size, ImU32 seed)
{
    ImU32 crc = ~seed;
    const unsigned char* data = (const unsigned char*)data_p;
    const ImU32* crc32_lut = GCrc32LookupTable;
    while (data_size-- != 0)
        crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ *data++];
    return ~crc;
}